

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

Cluster * __thiscall mkvparser::Segment::GetNext(Segment *this,Cluster *pCurr)

{
  Cluster **ppCVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  longlong lVar4;
  longlong lVar5;
  long lVar6;
  Cluster *pCVar7;
  Cluster **ppCVar8;
  long lVar9;
  long lVar10;
  Cluster **ppCVar11;
  long len;
  long local_48;
  long len_;
  longlong pos_;
  
  lVar9 = pCurr->m_index;
  if (lVar9 < 0) {
    lVar9 = pCurr->m_element_start;
    local_48 = this->m_size + this->m_start;
    lVar4 = GetUIntLength(this->m_pReader,lVar9,&len);
    if ((lVar4 == 0) && (lVar4 = ReadID(this->m_pReader,lVar9,&len), lVar4 == 0x1f43b675)) {
      lVar9 = lVar9 + len;
      GetUIntLength(this->m_pReader,lVar9,&len);
      lVar4 = ReadUInt(this->m_pReader,lVar9,&len);
      lVar9 = lVar4 + lVar9 + len;
      while (lVar10 = lVar9, lVar10 < local_48) {
        lVar4 = GetUIntLength(this->m_pReader,lVar10,&len);
        if ((lVar4 != 0) || (lVar4 = ReadID(this->m_pReader,lVar10,&len), lVar4 < 0))
        goto LAB_00152db0;
        lVar9 = len + lVar10;
        GetUIntLength(this->m_pReader,lVar9,&len);
        lVar5 = ReadUInt(this->m_pReader,lVar9,&len);
        lVar9 = lVar9 + len;
        if (lVar5 != 0) {
          if (lVar4 == 0x1f43b675) {
            lVar10 = lVar10 - this->m_start;
            lVar6 = Cluster::HasBlockEntries(this,lVar10,&pos_,&len_);
            if (0 < lVar6) goto LAB_00152d07;
          }
          lVar9 = lVar9 + lVar5;
        }
      }
      lVar10 = 0;
LAB_00152d07:
      if (0 < lVar10) {
        ppCVar11 = this->m_clusters + this->m_clusterCount;
        ppCVar8 = ppCVar11 + this->m_clusterPreloadCount;
        while (ppCVar11 < ppCVar8) {
          auVar2._8_8_ = (long)ppCVar8 - (long)ppCVar11 >> 0x3f;
          auVar2._0_8_ = (long)ppCVar8 - (long)ppCVar11 >> 3;
          ppCVar1 = ppCVar11 + SUB168(auVar2 / SEXT816(2),0);
          pCVar7 = *ppCVar1;
          lVar9 = pCVar7->m_element_start - pCVar7->m_pSegment->m_start;
          if (lVar9 < lVar10) {
            ppCVar11 = ppCVar1 + 1;
          }
          else {
            ppCVar8 = ppCVar1;
            if (lVar9 <= lVar10) {
              return pCVar7;
            }
          }
        }
        pCVar7 = Cluster::Create(this,-1,lVar10);
        if (pCVar7 != (Cluster *)0x0) {
          bVar3 = PreloadCluster(this,pCVar7,(long)ppCVar11 - (long)this->m_clusters >> 3);
          if (bVar3) {
            return pCVar7;
          }
          Cluster::~Cluster(pCVar7);
          operator_delete(pCVar7);
        }
      }
    }
LAB_00152db0:
    pCVar7 = (Cluster *)0x0;
  }
  else if (lVar9 + 1 < this->m_clusterCount) {
    pCVar7 = this->m_clusters[lVar9 + 1];
  }
  else {
    pCVar7 = &this->m_eos;
  }
  return pCVar7;
}

Assistant:

const Cluster* Segment::GetNext(const Cluster* pCurr) {
  assert(pCurr);
  assert(pCurr != &m_eos);
  assert(m_clusters);

  long idx = pCurr->m_index;

  if (idx >= 0) {
    assert(m_clusterCount > 0);
    assert(idx < m_clusterCount);
    assert(pCurr == m_clusters[idx]);

    ++idx;

    if (idx >= m_clusterCount)
      return &m_eos;  // caller will LoadCluster as desired

    Cluster* const pNext = m_clusters[idx];
    assert(pNext);
    assert(pNext->m_index >= 0);
    assert(pNext->m_index == idx);

    return pNext;
  }

  assert(m_clusterPreloadCount > 0);

  long long pos = pCurr->m_element_start;

  assert(m_size >= 0);  // TODO
  const long long stop = m_start + m_size;  // end of segment

  {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long id = ReadID(m_pReader, pos, len);
    if (id != libwebm::kMkvCluster)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size > 0);  // TODO
    // assert((pCurr->m_size <= 0) || (pCurr->m_size == size));

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    pos += size;  // consume payload
  }

  long long off_next = 0;

  while (pos < stop) {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long idpos = pos;  // pos of next (potential) cluster

    const long long id = ReadID(m_pReader, idpos, len);
    if (id < 0)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size >= 0);  // TODO

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvCluster) {
      const long long off_next_ = idpos - m_start;

      long long pos_;
      long len_;

      const long status = Cluster::HasBlockEntries(this, off_next_, pos_, len_);

      assert(status >= 0);

      if (status > 0) {
        off_next = off_next_;
        break;
      }
    }

    pos += size;  // consume payload
  }

  if (off_next <= 0)
    return 0;

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    // const long long pos_ = pNext->m_pos;
    // assert(pos_);
    // pos = pos_ * ((pos_ < 0) ? -1 : 1);

    pos = pNext->GetPosition();

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else
      return pNext;
  }

  assert(i == j);

  Cluster* const pNext = Cluster::Create(this, -1, off_next);
  if (pNext == NULL)
    return NULL;

  const ptrdiff_t idx_next = i - m_clusters;  // insertion position

  if (!PreloadCluster(pNext, idx_next)) {
    delete pNext;
    return NULL;
  }
  assert(m_clusters);
  assert(idx_next < m_clusterSize);
  assert(m_clusters[idx_next] == pNext);

  return pNext;
}